

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::csharp::WriteMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  MethodDescriptor *method_local;
  Printer *printer_local;
  
  WriteDocCommentBody<google::protobuf::MethodDescriptor>(printer,method);
  return;
}

Assistant:

void WriteMethodDocComment(io::Printer* printer, const MethodDescriptor* method) {
    WriteDocCommentBody(printer, method);
}